

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int async_func_init(JSContext *ctx,JSAsyncFunctionState *s,JSValue func_obj,JSValue this_obj,
                   int argc,JSValue *argv)

{
  list_head *plVar1;
  ushort uVar2;
  int *piVar3;
  undefined8 uVar4;
  JSValue *pJVar5;
  long lVar6;
  JSValueUnion JVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  JSValueUnion JVar12;
  JSRefCountHeader *p;
  
  JVar12 = this_obj.u;
  JVar7 = func_obj.u;
  plVar1 = &(s->frame).var_ref_list;
  (s->frame).var_ref_list.prev = plVar1;
  (s->frame).var_ref_list.next = plVar1;
  lVar6 = *(long *)((long)JVar7.ptr + 0x30);
  (s->frame).js_mode = (uint)*(byte *)(lVar6 + 0x18);
  (s->frame).cur_pc = *(uint8_t **)(lVar6 + 0x20);
  uVar9 = (uint)*(ushort *)(lVar6 + 0x40);
  if ((int)(uint)*(ushort *)(lVar6 + 0x40) <= argc) {
    uVar9 = argc;
  }
  iVar10 = *(ushort *)(lVar6 + 0x42) + uVar9;
  pJVar5 = (JSValue *)
           js_malloc(ctx,(ulong)(iVar10 + (uint)*(ushort *)(lVar6 + 0x46) +
                                (uint)(iVar10 + (uint)*(ushort *)(lVar6 + 0x46) == 0)) << 4);
  (s->frame).arg_buf = pJVar5;
  if (pJVar5 == (JSValue *)0x0) {
    iVar10 = -1;
  }
  else {
    if (0xfffffff4 < (uint)func_obj.tag) {
      *(int *)JVar7.ptr = *JVar7.ptr + 1;
    }
    (s->frame).cur_func.u.ptr = (void *)JVar7;
    (s->frame).cur_func.tag = func_obj.tag;
    if (0xfffffff4 < (uint)this_obj.tag) {
      *(int *)JVar12.ptr = *JVar12.ptr + 1;
    }
    (s->this_val).u.ptr = (void *)JVar12;
    (s->this_val).tag = this_obj.tag;
    s->argc = argc;
    (s->frame).arg_count = uVar9;
    (s->frame).var_buf = pJVar5 + uVar9;
    uVar2 = *(ushort *)(lVar6 + 0x42);
    (s->frame).cur_sp = pJVar5 + uVar9 + uVar2;
    if (0 < argc) {
      lVar11 = 0;
      do {
        pJVar5 = (s->frame).arg_buf;
        piVar3 = *(int **)((long)&argv->u + lVar11);
        uVar4 = *(undefined8 *)((long)&argv->tag + lVar11);
        if (0xfffffff4 < (uint)uVar4) {
          *piVar3 = *piVar3 + 1;
        }
        *(int **)((long)&pJVar5->u + lVar11) = piVar3;
        *(undefined8 *)((long)&pJVar5->tag + lVar11) = uVar4;
        lVar11 = lVar11 + 0x10;
      } while ((ulong)(uint)argc << 4 != lVar11);
      uVar2 = *(ushort *)(lVar6 + 0x42);
    }
    iVar10 = 0;
    if (argc < (int)(uVar9 + uVar2)) {
      lVar6 = ((ulong)uVar9 + (ulong)uVar2) - (long)argc;
      uVar8 = (long)argc << 4 | 8;
      do {
        pJVar5 = (s->frame).arg_buf;
        *(undefined4 *)((long)pJVar5 + (uVar8 - 8)) = 0;
        *(undefined8 *)((long)&pJVar5->u + uVar8) = 3;
        uVar8 = uVar8 + 0x10;
        lVar6 = lVar6 + -1;
        iVar10 = 0;
      } while (lVar6 != 0);
    }
  }
  return iVar10;
}

Assistant:

static __exception int async_func_init(JSContext *ctx, JSAsyncFunctionState *s,
                                       JSValueConst func_obj, JSValueConst this_obj,
                                       int argc, JSValueConst *argv)
{
    JSObject *p;
    JSFunctionBytecode *b;
    JSStackFrame *sf;
    int local_count, i, arg_buf_len, n;

    sf = &s->frame;
    init_list_head(&sf->var_ref_list);
    p = JS_VALUE_GET_OBJ(func_obj);
    b = p->u.func.function_bytecode;
    sf->js_mode = b->js_mode;
    sf->cur_pc = b->byte_code_buf;
    arg_buf_len = max_int(b->arg_count, argc);
    local_count = arg_buf_len + b->var_count + b->stack_size;
    sf->arg_buf = js_malloc(ctx, sizeof(JSValue) * max_int(local_count, 1));
    if (!sf->arg_buf)
        return -1;
    sf->cur_func = JS_DupValue(ctx, func_obj);
    s->this_val = JS_DupValue(ctx, this_obj);
    s->argc = argc;
    sf->arg_count = arg_buf_len;
    sf->var_buf = sf->arg_buf + arg_buf_len;
    sf->cur_sp = sf->var_buf + b->var_count;
    for(i = 0; i < argc; i++)
        sf->arg_buf[i] = JS_DupValue(ctx, argv[i]);
    n = arg_buf_len + b->var_count;
    for(i = argc; i < n; i++)
        sf->arg_buf[i] = JS_UNDEFINED;
    return 0;
}